

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  undefined1 auVar1 [16];
  bool bVar2;
  EnumValueDescriptor *pEVar3;
  reference ppEVar4;
  DescriptorPool *pDVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  EnumValuesByNumberSet *this_01;
  int number_local;
  EnumValueDescriptor *result;
  WriterMutexLock l_1;
  Tables *tables;
  string enum_value_name;
  undefined1 local_220 [32];
  MutexLockMaybe l2;
  iterator it_1;
  ParentNumberQuery query;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 local_1a0 [8];
  char acStack_198 [8];
  string local_190 [32];
  ReaderMutexLock l;
  ReaderMutexLock local_168;
  iterator it;
  
  number_local = number;
  pEVar3 = FindEnumValueByNumber(this,parent,number);
  if (pEVar3 == (EnumValueDescriptor *)0x0) {
    local_168 = (ReaderMutexLock)l.mu_;
    l.mu_ = &this->unknown_enum_values_mu_;
    query.query.first = parent;
    query.query.second = number;
    absl::lts_20240722::Mutex::ReaderLock();
    this_01 = &this->unknown_enum_values_by_number_;
    it = absl::lts_20240722::container_internal::
         raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                   (&this_01->
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ,&query);
    l2.mu_ = (Mutex *)0x0;
    bVar2 = absl::lts_20240722::container_internal::operator!=(&it,(iterator *)&l2);
    if (bVar2) {
      ppEVar4 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::iterator::operator*(&it);
      pEVar3 = *ppEVar4;
    }
    else {
      pEVar3 = (EnumValueDescriptor *)0x0;
    }
    absl::lts_20240722::ReaderMutexLock::~ReaderMutexLock(&l);
    if (!bVar2) {
      l_1.mu_ = &this->unknown_enum_values_mu_;
      absl::lts_20240722::Mutex::Lock();
      it_1 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                       (&this_01->
                         super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        ,&query);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = it.field_1;
      it = (iterator)(auVar1 << 0x40);
      bVar2 = absl::lts_20240722::container_internal::operator!=(&it_1,&it);
      if (bVar2) {
        ppEVar4 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::iterator::operator*(&it_1);
        pEVar3 = *ppEVar4;
      }
      else {
        it.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)(slot_type *)0x18;
        it.ctrl_ = "UNKNOWN_ENUM_VALUE_%s_%d";
        absl::lts_20240722::
        StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  (&enum_value_name,(FormatSpec<std::__cxx11::basic_string<char>,_int> *)&it,
                   parent->all_names_,&number_local);
        pDVar5 = DescriptorPool::generated_pool();
        tables = (pDVar5->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl;
        memset((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)&it,0,0xe0);
        anon_unknown_23::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::PlanArray<google::protobuf::EnumValueDescriptor>
                  ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    *)&it,1);
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)&it,2);
        absl::lts_20240722::MutexLockMaybe::MutexLockMaybe(&l2,pDVar5->mutex_);
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)&it,&tables);
        absl::lts_20240722::MutexLockMaybe::~MutexLockMaybe(&l2);
        pEVar3 = anon_unknown_23::
                 FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ::AllocateArray<google::protobuf::EnumValueDescriptor>
                           ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                             *)&it,1);
        l2.mu_ = (Mutex *)parent->all_names_[1]._M_string_length;
        result = pEVar3;
        _l = absl::lts_20240722::NullSafeStringView(".");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_220,(AlphaNum *)&l2,(AlphaNum *)&l);
        this_00 = (anonymous_namespace)::
                  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  ::AllocateArray<std::__cxx11::string>
                            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                              *)&it,2);
        std::__cxx11::string::string(local_190,(string *)&enum_value_name);
        std::__cxx11::string::operator=((string *)this_00,local_190);
        local_1b0 = local_1a0;
        if ((undefined1 *)local_220._0_8_ == local_220 + 0x10) {
          acStack_198[0] = local_220[0x18];
          acStack_198[1] = local_220[0x19];
          acStack_198[2] = local_220[0x1a];
          acStack_198[3] = local_220[0x1b];
          acStack_198[4] = local_220[0x1c];
          acStack_198[5] = local_220[0x1d];
          acStack_198[6] = local_220[0x1e];
          acStack_198[7] = local_220[0x1f];
        }
        else {
          local_1b0 = (undefined1 *)local_220._0_8_;
        }
        local_1a8 = (char *)local_220._8_8_;
        local_220._8_8_ = (char *)0x0;
        local_220[0x10] = '\0';
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::operator=((string *)(this_00 + 1),(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string(local_190);
        pEVar3->all_names_ = this_00;
        std::__cxx11::string::~string((string *)local_220);
        pEVar3->number_ = number_local;
        pEVar3->type_ = parent;
        pEVar3->options_ = (EnumValueOptions *)&_EnumValueOptions_default_instance_;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        ::insert<google::protobuf::EnumValueDescriptor_*,_0,_0>
                  ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
                    *)&l2,&this_01->
                           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   ,&result);
        pEVar3 = result;
        std::__cxx11::string::~string((string *)&enum_value_name);
      }
      absl::lts_20240722::WriterMutexLock::~WriterMutexLock(&l_1);
    }
  }
  return pEVar3;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const auto* value = FindEnumValueByNumber(parent, number);
    if (value != nullptr) {
      return value;
    }
  }

  const ParentNumberQuery query{{parent, number}};

  // Second try, with reader lock held on unknown enum values: common case.
  {
    absl::ReaderMutexLock l(&unknown_enum_values_mu_);
    auto it = unknown_enum_values_by_number_.find(query);
    if (it != unknown_enum_values_by_number_.end()) {
      return *it;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    absl::WriterMutexLock l(&unknown_enum_values_mu_);
    auto it = unknown_enum_values_by_number_.find(query);
    if (it != unknown_enum_values_by_number_.end()) {
      return *it;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    std::string enum_value_name =
        absl::StrFormat("UNKNOWN_ENUM_VALUE_%s_%d", parent->name(), number);
    auto* pool = DescriptorPool::generated_pool();
    auto* tables = const_cast<DescriptorPool::Tables*>(pool->tables_.get());
    internal::FlatAllocator alloc;
    alloc.PlanArray<EnumValueDescriptor>(1);
    alloc.PlanArray<std::string>(2);

    {
      // Must lock the pool because we will do allocations in the shared arena.
      absl::MutexLockMaybe l2(pool->mutex_);
      alloc.FinalizePlanning(tables);
    }
    EnumValueDescriptor* result = alloc.AllocateArray<EnumValueDescriptor>(1);
    result->all_names_ = alloc.AllocateStrings(
        enum_value_name,
        absl::StrCat(parent->full_name(), ".", enum_value_name));
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    unknown_enum_values_by_number_.insert(result);
    return result;
  }
}